

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_valueConstructor1_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>::
optTyped_valueConstructor1_Test
          (optTyped_valueConstructor1_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
           *this)

{
  optTyped_valueConstructor1_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_> *this_local
  ;
  
  anon_unknown.dwarf_dc07::optTyped<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>::optTyped
            (&this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>);
  (this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).super_Test.
  _vptr_Test = (_func_int **)&PTR__optTyped_valueConstructor1_Test_002605a8;
  return;
}

Assistant:

TYPED_TEST(optTyped, valueConstructor1)
{
  using opt_type = typename TestFixture::type;
  opt_type o{this->value_1};
  EXPECT_TRUE(o);
  EXPECT_TRUE(o.has_value());
  EXPECT_EQ(this->value_1, *o);
  EXPECT_EQ(this->value_1, o.value());
  EXPECT_EQ(this->value_1, o.value_or(this->value_2));

  const opt_type& co{o};
  EXPECT_TRUE(co);
  EXPECT_TRUE(co.has_value());
  EXPECT_EQ(this->value_1, *co);
  EXPECT_EQ(this->value_1, co.value());
  EXPECT_EQ(this->value_1, co.value_or(this->value_2));
}